

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbinflow.cpp
# Opt level: O0

void pele::physics::turbinflow::TurbInflow::set_turb
               (int normDir,int transDir1,int transDir2,FArrayBox *v,FArrayBox *data,int dcomp)

{
  BaseFab<double> *in_RCX;
  long in_R8;
  int in_R9D;
  Array4<double> *v_out;
  Array4<double> *v_in;
  Box *box;
  undefined1 auStackY_378 [48];
  anon_class_144_5_078e5cc1 *in_stack_fffffffffffffcb8;
  Box *in_stack_fffffffffffffcc0;
  undefined1 auStack_338 [64];
  Array4<double> local_2f8;
  Array4<double> *local_2b8;
  Array4<double> local_2b0;
  Array4<double> *local_270;
  Box *local_268;
  int local_25c;
  long local_258;
  BaseFab<double> *local_250;
  BaseFab<double> *local_238;
  Array4<double> local_230;
  int local_1ec;
  long local_1e8;
  Dim3 local_1e0;
  Dim3 local_1cc;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  Dim3 local_180;
  Dim3 local_170;
  Dim3 local_160;
  int local_154;
  Box *local_150;
  double *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  Box *local_118;
  undefined4 local_10c;
  Box *local_108;
  undefined4 local_fc;
  Box *local_f8;
  Dim3 local_f0;
  undefined8 *local_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  int local_d0;
  undefined4 local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  undefined8 *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  IntVect *local_78;
  undefined4 local_6c;
  IntVect *local_68;
  undefined4 local_5c;
  IntVect *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_25c = in_R9D;
  local_258 = in_R8;
  local_250 = in_RCX;
  local_268 = amrex::BaseFab<double>::box(in_RCX);
  local_238 = local_250;
  local_148 = local_250->dptr;
  local_150 = &local_250->domain;
  local_154 = local_250->nvar;
  local_fc = 0;
  local_128 = (local_150->smallend).vect[0];
  local_10c = 1;
  iStack_124 = (local_250->domain).smallend.vect[1];
  local_170.x = (local_150->smallend).vect[0];
  local_170.y = (local_150->smallend).vect[1];
  local_11c = 2;
  local_170.z = (local_250->domain).smallend.vect[2];
  local_58 = &(local_250->domain).bigend;
  local_5c = 0;
  local_88 = local_58->vect[0] + 1;
  local_68 = &(local_250->domain).bigend;
  local_6c = 1;
  iStack_84 = (local_250->domain).bigend.vect[1] + 1;
  local_78 = &(local_250->domain).bigend;
  local_7c = 2;
  local_190.z = (local_250->domain).bigend.vect[2] + 1;
  local_190.y = iStack_84;
  local_190.x = local_88;
  local_180._0_8_ = local_190._0_8_;
  local_180.z = local_190.z;
  local_160._0_8_ = local_170._0_8_;
  local_160.z = local_170.z;
  local_140._0_8_ = local_170._0_8_;
  local_140.z = local_170.z;
  local_130 = local_150;
  local_120 = local_170.z;
  local_118 = local_150;
  local_108 = local_150;
  local_f8 = local_150;
  local_a0._0_8_ = local_190._0_8_;
  local_a0.z = local_190.z;
  local_90 = local_150;
  local_80 = local_190.z;
  amrex::Array4<double>::Array4(&local_2b0,local_148,&local_160,&local_180,local_154);
  local_1e8 = local_258;
  local_1ec = local_25c;
  local_198 = *(double **)(local_258 + 0x10);
  local_1a0 = (undefined8 *)(local_258 + 0x18);
  local_1a4 = *(int *)(local_258 + 0x34);
  local_ac = 0;
  local_d8 = *(undefined4 *)local_1a0;
  local_bc = 1;
  uStack_d4 = *(undefined4 *)(local_258 + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_cc = 2;
  local_1c0.z = *(int *)(local_258 + 0x20);
  local_8 = (int *)(local_258 + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = local_258 + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(local_258 + 0x28) + 1;
  local_28 = local_258 + 0x24;
  local_2c = 2;
  local_1e0.z = *(int *)(local_258 + 0x2c) + 1;
  local_1e0.y = iStack_34;
  local_1e0.x = local_38;
  local_270 = &local_2b0;
  local_1cc._0_8_ = local_1e0._0_8_;
  local_1cc.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_f0._0_8_ = local_1c0._0_8_;
  local_f0.z = local_1c0.z;
  local_e0 = local_1a0;
  local_d0 = local_1c0.z;
  local_c8 = local_1a0;
  local_b8 = local_1a0;
  local_a8 = local_1a0;
  local_50._0_8_ = local_1e0._0_8_;
  local_50.z = local_1e0.z;
  local_40 = local_1a0;
  local_30 = local_1e0.z;
  amrex::Array4<double>::Array4(&local_230,local_198,&local_1b0,&local_1cc,local_1a4);
  amrex::Array4<double>::Array4<double,_0>(&local_2f8,&local_230,local_1ec);
  local_2b8 = &local_2f8;
  memcpy(auStackY_378,local_2b8,0x3c);
  memcpy(auStack_338,local_270,0x3c);
  amrex::
  ParallelFor<pele::physics::turbinflow::TurbInflow::set_turb(int,int,int,amrex::FArrayBox&,amrex::FArrayBox&,int)::__0>
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  return;
}

Assistant:

void
TurbInflow::set_turb(
  int normDir,
  int transDir1,
  int transDir2,
  amrex::FArrayBox& v,
  amrex::FArrayBox& data,
  const int dcomp)
{
  // copy velocity fluctuations from plane into data
  const auto& box = v.box(); // z-normal plane
  const auto& v_in = v.array();
  const auto& v_out = data.array(dcomp);

  amrex::ParallelFor(box, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
    // From z-normal box index to data box index
    int idx[3] = {0};
    idx[transDir1] = i;
    idx[transDir2] = j;
    idx[normDir] = k;
    v_out(idx[0], idx[1], idx[2], transDir1) =
      v_in(i, j, k, 0); // transverse velocity 1
    v_out(idx[0], idx[1], idx[2], transDir2) =
      v_in(i, j, k, 1); // transverse velocity 2
    v_out(idx[0], idx[1], idx[2], normDir) =
      v_in(i, j, k, 2); // normal velocity
  });
}